

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::makepoint(tetgenmesh *this,point *pnewpoint,verttype vtype)

{
  point pdVar1;
  int local_20;
  int i;
  verttype vtype_local;
  point *pnewpoint_local;
  tetgenmesh *this_local;
  
  pdVar1 = (point)memorypool::alloc(this->points);
  *pnewpoint = pdVar1;
  for (local_20 = 0; local_20 < this->numpointattrib; local_20 = local_20 + 1) {
    (*pnewpoint)[local_20 + 3] = 0.0;
  }
  for (local_20 = 0; local_20 < this->sizeoftensor; local_20 = local_20 + 1) {
    (*pnewpoint)[this->pointmtrindex + local_20] = 0.0;
  }
  setpoint2tet(this,*pnewpoint,(tetrahedron)0x0);
  setpoint2ppt(this,*pnewpoint,(point)0x0);
  if ((((this->b->plc != 0) || (this->b->refine != 0)) &&
      (setpoint2sh(this,*pnewpoint,(shellface)0x0), this->b->metric != 0)) &&
     (this->bgm != (tetgenmesh *)0x0)) {
    setpoint2bgmtet(this,*pnewpoint,(tetrahedron)0x0);
  }
  setpointmark(this,*pnewpoint,
               (int)this->points->items - (uint)((this->in->firstnumber != 0 ^ 0xffU) & 1));
  *(undefined4 *)((long)*pnewpoint + (long)(this->pointmarkindex + 1) * 4) = 0;
  setpointtype(this,*pnewpoint,vtype);
  return;
}

Assistant:

void tetgenmesh::makepoint(point* pnewpoint, enum verttype vtype)
{
  int i;

  *pnewpoint = (point) points->alloc();

  // Initialize the point attributes.
  for (i = 0; i < numpointattrib; i++) {
    (*pnewpoint)[3 + i] = 0.0;
  }
  // Initialize the metric tensor.
  for (i = 0; i < sizeoftensor; i++) {
    (*pnewpoint)[pointmtrindex + i] = 0.0;
  }
  setpoint2tet(*pnewpoint, NULL);
  setpoint2ppt(*pnewpoint, NULL);
  if (b->plc || b->refine) {
    // Initialize the point-to-simplex field.
    setpoint2sh(*pnewpoint, NULL);
    if (b->metric && (bgm != NULL)) {
      setpoint2bgmtet(*pnewpoint, NULL);
    }
  }
  // Initialize the point marker (starting from in->firstnumber).
  setpointmark(*pnewpoint, (int) (points->items) - (!in->firstnumber));
  // Clear all flags.
  ((int *) (*pnewpoint))[pointmarkindex + 1] = 0;
  // Initialize (set) the point type. 
  setpointtype(*pnewpoint, vtype);
}